

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  N_Vector y_00;
  N_Vector atol;
  sunrealtype t_00;
  sunrealtype rtol;
  int rootsfound [2];
  int retvalr;
  int iout;
  int retval;
  void *cvode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector constraints;
  N_Vector abstol;
  N_Vector y;
  sunrealtype tout;
  sunrealtype t;
  SUNContext sunctx;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  double local_20;
  undefined1 local_18 [8];
  void *in_stack_fffffffffffffff0;
  int local_4;
  
  uVar1 = SUNContext_Create(0,&stack0xfffffffffffffff0);
  iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                       (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
  if (iVar2 == 0) {
    plVar5 = (long *)N_VNew_Serial(3,in_stack_fffffffffffffff0);
    iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                         (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
    if (iVar2 == 0) {
      **(undefined8 **)(*plVar5 + 0x10) = 0x3ff0000000000000;
      *(undefined8 *)(*(long *)(*plVar5 + 0x10) + 8) = 0;
      *(undefined8 *)(*(long *)(*plVar5 + 0x10) + 0x10) = 0;
      plVar6 = (long *)N_VNew_Serial(3,in_stack_fffffffffffffff0);
      iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                           (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
      if (iVar2 == 0) {
        **(undefined8 **)(*plVar6 + 0x10) = 0x3eb0c6f7a0b5ed8d;
        *(undefined8 *)(*(long *)(*plVar6 + 0x10) + 8) = 0x3da5fd7fe1796495;
        *(undefined8 *)(*(long *)(*plVar6 + 0x10) + 0x10) = 0x3ee4f8b588e368f1;
        y_00 = (N_Vector)N_VNew_Serial(3,in_stack_fffffffffffffff0);
        iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9c);
        if (iVar2 == 0) {
          N_VConst(0x3ff0000000000000,y_00);
          atol = (N_Vector)CVodeCreate(2,in_stack_fffffffffffffff0);
          iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                               ,in_stack_ffffffffffffff9c);
          if (iVar2 == 0) {
            uVar1 = CVodeInit(0,atol,f,plVar5);
            iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                 (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9c);
            if (iVar2 == 0) {
              uVar1 = CVodeSVtolerances(0x3f1a36e2eb1c432d,atol,plVar6);
              iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                   (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
              if (iVar2 == 0) {
                uVar1 = CVodeRootInit(atol,2,g);
                iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                     (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0),
                                     in_stack_ffffffffffffff9c);
                if (iVar2 == 0) {
                  t_00 = (sunrealtype)SUNDenseMatrix(3,3,in_stack_fffffffffffffff0);
                  iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                       (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                        in_stack_ffffffffffffffa0),
                                       in_stack_ffffffffffffff9c);
                  if (iVar2 == 0) {
                    rtol = (sunrealtype)SUNLinSol_Dense(plVar5,t_00,in_stack_fffffffffffffff0);
                    iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                         (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                          in_stack_ffffffffffffffa0),
                                         in_stack_ffffffffffffff9c);
                    if (iVar2 == 0) {
                      uVar1 = CVodeSetLinearSolver(atol,rtol,t_00);
                      iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                           (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                            in_stack_ffffffffffffffa0),
                                           in_stack_ffffffffffffff9c);
                      if (iVar2 == 0) {
                        uVar1 = CVodeSetJacFn(atol,Jac);
                        iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                             (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                              in_stack_ffffffffffffffa0),
                                             in_stack_ffffffffffffff9c);
                        if (iVar2 == 0) {
                          uVar1 = CVodeSetConstraints(atol,y_00);
                          iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),
                                               (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                                in_stack_ffffffffffffffa0),
                                               in_stack_ffffffffffffff9c);
                          if (iVar2 == 0) {
                            N_VDestroy(y_00);
                            printf(" \n3-species kinetics problem\n\n");
                            iVar2 = 0;
                            local_20 = 0.4;
                            do {
                              iVar3 = CVode(local_20,atol,plVar5,local_18,1);
                              PrintOutput((sunrealtype)atol,(sunrealtype)CONCAT44(iVar3,iVar2),
                                          (sunrealtype)
                                          CONCAT44(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0),
                                          (sunrealtype)
                                          CONCAT44(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98));
                              if (iVar3 == 2) {
                                in_stack_ffffffffffffffa4 =
                                     CVodeGetRootInfo(atol,&stack0xffffffffffffff9c);
                                iVar4 = check_retval((void *)CONCAT44(iVar3,iVar2),
                                                     (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                                      in_stack_ffffffffffffffa0),
                                                     in_stack_ffffffffffffff9c);
                                if (iVar4 != 0) {
                                  return 1;
                                }
                                PrintRootInfo(0,0x102853);
                              }
                              iVar4 = check_retval((void *)CONCAT44(iVar3,iVar2),
                                                   (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                                    in_stack_ffffffffffffffa0),
                                                   in_stack_ffffffffffffff9c);
                              if (iVar4 != 0) break;
                              if (iVar3 == 0) {
                                iVar2 = iVar2 + 1;
                                local_20 = local_20 * 10.0;
                              }
                            } while (iVar2 != 0xc);
                            PrintFinalStats(in_stack_fffffffffffffff0);
                            local_4 = check_ans(y_00,t_00,rtol,atol);
                            N_VDestroy(plVar5);
                            N_VDestroy(plVar6);
                            CVodeFree(&stack0xffffffffffffffb0);
                            SUNLinSolFree(rtol);
                            SUNMatDestroy(t_00);
                            SUNContext_Free(&stack0xfffffffffffffff0);
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  N_Vector constraints;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  int retvalr;
  int rootsfound[2];

  y           = NULL;
  abstol      = NULL;
  constraints = NULL;
  A           = NULL;
  LS          = NULL;
  cvode_mem   = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  Ith(abstol, 1) = ATOL1;
  Ith(abstol, 2) = ATOL2;
  Ith(abstol, 3) = ATOL3;

  /* Set constraints to all 1's for nonnegative solution values. */
  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  N_VConst(ONE, constraints);

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeRootInit to specify the root function g with 2 components */
  retval = CVodeRootInit(cvode_mem, 2, g);
  if (check_retval(&retval, "CVodeRootInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeSetConstraints to initialize constraints */
  retval = CVodeSetConstraints(cvode_mem, constraints);
  if (check_retval(&retval, "CVodeSetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  printf(" \n3-species kinetics problem\n\n");

  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, Ith(y, 1), Ith(y, 2), Ith(y, 3));

    if (retval == CV_ROOT_RETURN)
    {
      retvalr = CVodeGetRootInfo(cvode_mem, rootsfound);
      if (check_retval(&retvalr, "CVodeGetRootInfo", 1)) { return (1); }
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (check_retval(&retval, "CVode", 1)) { break; }
    if (retval == CV_SUCCESS)
    {
      iout++;
      tout *= TMULT;
    }

    if (iout == NOUT) { break; }
  }

  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* check the solution error */
  retval = check_ans(y, t, RTOL, abstol);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODE memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (retval);
}